

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Instr * __thiscall
GlobOpt::PRE::InsertPropertySymPreloadInLandingPad
          (PRE *this,Instr *ldInstr,Loop *loop,PropertySym *propertySym)

{
  BasicBlock *pBVar1;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  bool bVar2;
  SymOpnd *pSVar3;
  PropertySym *pPVar4;
  Value *pVVar5;
  Value *pVVar6;
  PropertySymOpnd *pPVar7;
  StackSym *pSVar8;
  
  pSVar3 = IR::Opnd::AsSymOpnd(ldInstr->m_src1);
  if ((PropertySym *)pSVar3->m_sym != propertySym) {
    pBVar1 = this->globOpt->currentBlock;
    pPVar4 = Sym::AsPropertySym(pSVar3->m_sym);
    pVVar5 = GlobOptBlockData::FindValue(&pBVar1->globOptData,&pPVar4->m_stackSym->super_Sym);
    pVVar6 = GlobOptBlockData::FindValue
                       (&this->globOpt->currentBlock->globOptData,
                        &propertySym->m_stackSym->super_Sym);
    if (pVVar5 == (Value *)0x0) {
      return (Instr *)0x0;
    }
    if (pVVar6 == (Value *)0x0) {
      return (Instr *)0x0;
    }
    if (pVVar5->valueNumber != pVVar6->valueNumber) {
      return (Instr *)0x0;
    }
  }
  pSVar3 = IR::Opnd::AsSymOpnd(ldInstr->m_src1);
  pSVar3->m_sym = &propertySym->super_Sym;
  pSVar3 = IR::Opnd::AsSymOpnd(ldInstr->m_src1);
  bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar3);
  if (bVar2) {
    pPVar7 = IR::Opnd::AsPropertySymOpnd(&pSVar3->super_Opnd);
    pPVar7 = IR::Opnd::AsPropertySymOpnd((Opnd *)pPVar7);
    pPVar7 = IR::PropertySymOpnd::CopyWithoutFlowSensitiveInfo(pPVar7,this->globOpt->func);
    IR::Instr::ReplaceSrc1(ldInstr,(Opnd *)pPVar7);
  }
  if (ldInstr->m_dst != (Opnd *)0x0) {
    this_00 = (loop->landingPad->globOptData).liveVarSyms;
    pSVar8 = IR::Opnd::GetStackSym(ldInstr->m_dst);
    BVSparse<Memory::JitArenaAllocator>::Set(this_00,(pSVar8->super_Sym).m_id);
  }
  InsertInstrInLandingPad(this,ldInstr,loop);
  return ldInstr;
}

Assistant:

IR::Instr *
GlobOpt::PRE::InsertPropertySymPreloadInLandingPad(IR::Instr * ldInstr, Loop * loop, PropertySym * propertySym)
{
    IR::SymOpnd *ldSrc = ldInstr->GetSrc1()->AsSymOpnd();

    if (ldSrc->m_sym != propertySym)
    {
        // It's possible that the property syms are different but have equivalent objPtrs. Verify their values.
        Value *val1 = globOpt->CurrentBlockData()->FindValue(ldSrc->m_sym->AsPropertySym()->m_stackSym);
        Value *val2 = globOpt->CurrentBlockData()->FindValue(propertySym->m_stackSym);
        if (!val1 || !val2 || val1->GetValueNumber() != val2->GetValueNumber())
        {
            return nullptr;
        }
    }

    // Consider: Shouldn't be necessary once we have copy-prop in prepass...
    ldInstr->GetSrc1()->AsSymOpnd()->m_sym = propertySym;
    ldSrc = ldInstr->GetSrc1()->AsSymOpnd();

    if (ldSrc->IsPropertySymOpnd())
    {
        IR::PropertySymOpnd *propSymOpnd = ldSrc->AsPropertySymOpnd();
        IR::PropertySymOpnd *newPropSymOpnd;

        newPropSymOpnd = propSymOpnd->AsPropertySymOpnd()->CopyWithoutFlowSensitiveInfo(this->globOpt->func);
        ldInstr->ReplaceSrc1(newPropSymOpnd);
    }

    if (ldInstr->GetDst())
    {
        loop->landingPad->globOptData.liveVarSyms->Set(ldInstr->GetDst()->GetStackSym()->m_id);
    }

    InsertInstrInLandingPad(ldInstr, loop);

    return ldInstr;
}